

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_compress_fast_extState
              (void *state,char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  int iVar1;
  short sVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  long *plVar6;
  long *plVar7;
  long lVar8;
  int *piVar9;
  int *piVar10;
  int iVar11;
  ulong *puVar12;
  long lVar13;
  ushort uVar14;
  int *piVar15;
  ulong *puVar16;
  ulong *puVar17;
  int iVar18;
  uint uVar19;
  long *plVar20;
  char cVar21;
  long *plVar22;
  char *pcVar23;
  long lVar24;
  char *pcVar25;
  short *psVar26;
  uint uVar27;
  char *pcVar28;
  uint uVar29;
  short *psVar30;
  BYTE *s;
  BYTE *s_3;
  BYTE *e;
  long *plVar31;
  long lVar32;
  short *psVar33;
  int iVar34;
  uint uVar35;
  BYTE *e_1;
  ulong *puVar36;
  int *local_b0;
  U16 *hashTable;
  short *local_90;
  
  iVar11 = 0;
  if (((ulong)state & 7) == 0 && state != (void *)0x0) {
    memset(state,0,0x4020);
    hashTable = (U16 *)state;
  }
  else {
    hashTable = (U16 *)0x0;
  }
  if (acceleration < 2) {
    acceleration = 1;
  }
  if (0x10000 < acceleration) {
    acceleration = 0x10001;
  }
  if ((uint)inputSize < 0x7e000001) {
    iVar11 = inputSize + (uint)inputSize / 0xff + 0x10;
  }
  iVar34 = (int)dest;
  local_b0 = (int *)source;
  if (maxOutputSize < iVar11) {
    if (inputSize < 0x1000b) {
      if (0x7e000000 < (uint)inputSize) {
        return 0;
      }
      if (inputSize != 0) {
        uVar19 = *(uint *)(hashTable + 0x2008);
        pcVar28 = dest + maxOutputSize;
        *(int *)(hashTable + 0x200c) = *(int *)(hashTable + 0x200c) + inputSize;
        *(uint *)(hashTable + 0x2008) = uVar19 + inputSize;
        hashTable[0x200a] = 3;
        hashTable[0x200b] = 0;
        if ((uint)inputSize < 0xd) {
LAB_00114ca4:
          pcVar25 = source + ((ulong)(uint)inputSize - (long)local_b0);
          if (pcVar28 < (char *)((long)dest + (long)(pcVar25 + (ulong)(pcVar25 + 0xf0) / 0xff + 1)))
          {
            return 0;
          }
          if (pcVar25 < (char *)0xf) {
            *dest = (char)pcVar25 << 4;
          }
          else {
            pcVar28 = pcVar25 + -0xf;
            *dest = -0x10;
            psVar26 = (short *)((long)dest + 1);
            if ((char *)0xfe < pcVar28) {
              uVar5 = (ulong)(pcVar25 + -0x10e) / 0xff;
              memset(psVar26,0xff,uVar5 + 1);
              pcVar28 = pcVar25 + uVar5 * -0xff + -0x10e;
              psVar26 = (short *)((long)dest + uVar5 + 2);
            }
            *(char *)psVar26 = (char)pcVar28;
            dest = (char *)psVar26;
          }
          memcpy((char *)((long)dest + 1),local_b0,(size_t)pcVar25);
          return ((int)(char *)((long)dest + 1) + (int)pcVar25) - iVar34;
        }
        lVar32 = (long)source - (ulong)uVar19;
        hashTable[(uint)(*(int *)source * -0x61c8864f) >> 0x13] = (U16)uVar19;
        puVar12 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
        piVar15 = (int *)source;
        local_90 = (short *)dest;
LAB_0011449c:
        uVar5 = 1;
        iVar11 = *(int *)((long)piVar15 + 1);
        piVar9 = (int *)((long)piVar15 + 1);
        uVar19 = acceleration << 6;
        do {
          piVar10 = piVar9;
          piVar9 = (int *)(uVar5 + (long)piVar10);
          dest = (char *)local_90;
          local_b0 = piVar15;
          if (source + ((ulong)(uint)inputSize - 0xb) < piVar9) goto LAB_00114ca4;
          uVar5 = (ulong)(uVar19 >> 6);
          uVar19 = uVar19 + 1;
          uVar27 = (uint)(iVar11 * -0x61c8864f) >> 0x13;
          uVar14 = hashTable[uVar27];
          sVar2 = (short)lVar32;
          iVar11 = *piVar9;
          hashTable[uVar27] = (short)piVar10 - sVar2;
        } while (*(int *)(lVar32 + (ulong)uVar14) != *piVar10);
        lVar8 = (ulong)uVar14 + lVar32;
        uVar27 = (int)piVar10 - (int)piVar15;
        lVar13 = 0;
        uVar19 = uVar27 - 0xf;
        cVar3 = (char)piVar10 * '\x10' + (char)piVar15 * -0x10;
        do {
          cVar21 = cVar3;
          uVar35 = uVar19;
          lVar24 = lVar13;
          pcVar25 = (char *)(lVar8 + lVar24);
          local_b0 = (int *)((long)piVar10 + lVar24);
          if ((pcVar25 <= source) || (local_b0 <= piVar15)) break;
          lVar13 = lVar24 + -1;
          uVar19 = uVar35 - 1;
          cVar3 = cVar21 + -0x10;
        } while (*(char *)((long)piVar10 + lVar24 + -1) == *(char *)(lVar8 + -1 + lVar24));
        iVar11 = (int)lVar24;
        uVar5 = (ulong)(uint)(iVar11 + ((int)piVar10 - (int)piVar15));
        if (pcVar28 < (char *)((long)local_90 +
                              ((ulong)uVar27 + lVar24 & 0xffffffff) / 0xff + uVar5 + 9)) {
          return 0;
        }
        psVar26 = (short *)((long)local_90 + 1);
        if ((uint)((ulong)uVar27 + lVar24) < 0xf) {
          *(char *)local_90 = cVar21;
        }
        else {
          uVar4 = (ulong)(uVar27 - 0xf) + lVar24;
          *(char *)local_90 = -0x10;
          if (0xfe < (int)uVar4) {
            uVar19 = 0x1fd;
            if (uVar35 < 0x1fd) {
              uVar19 = uVar35;
            }
            if (0x1fc < (int)uVar35) {
              uVar35 = 0x1fd;
            }
            memset(psVar26,0xff,(ulong)((((uVar27 + 0xef) - uVar19) + iVar11) / 0xff + 1));
            uVar19 = ((uVar27 + 0xef) - uVar35) + iVar11;
            psVar26 = (short *)((long)local_90 + (ulong)uVar19 / 0xff + 2);
            uVar4 = (ulong)((uVar27 - 0x10e) + iVar11 + (uVar19 % 0xff - uVar19));
          }
          *(char *)psVar26 = (char)uVar4;
          psVar26 = (short *)((long)psVar26 + 1);
        }
        psVar33 = (short *)(uVar5 + (long)psVar26);
        do {
          *(undefined8 *)psVar26 = *(undefined8 *)piVar15;
          psVar26 = psVar26 + 4;
          piVar15 = piVar15 + 2;
        } while (psVar26 < psVar33);
        do {
          *psVar33 = (short)local_b0 - (short)pcVar25;
          puVar17 = (ulong *)(local_b0 + 1);
          puVar16 = (ulong *)(pcVar25 + 4);
          puVar36 = puVar17;
          if (puVar17 < puVar12) {
            if (*puVar16 == *puVar17) {
              puVar16 = (ulong *)(pcVar25 + 0xc);
              puVar36 = (ulong *)(local_b0 + 3);
              goto LAB_00114694;
            }
            uVar5 = *puVar17 ^ *puVar16;
            lVar13 = 0;
            if (uVar5 != 0) {
              for (; (uVar5 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
              }
            }
            uVar19 = (uint)lVar13 >> 3;
          }
          else {
LAB_00114694:
            if (puVar36 < puVar12) {
              iVar11 = ((int)puVar36 - (int)local_b0) + -4;
LAB_001146a4:
              if (*puVar16 == *puVar36) goto code_r0x001146af;
              uVar4 = *puVar36 ^ *puVar16;
              uVar5 = 0;
              if (uVar4 != 0) {
                for (; (uVar4 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                }
              }
              uVar19 = ((uint)(uVar5 >> 3) & 0x1fffffff) + iVar11;
              goto LAB_00114727;
            }
LAB_001146bf:
            if ((puVar36 < source + ((ulong)(uint)inputSize - 8)) &&
               ((int)*puVar16 == (int)*puVar36)) {
              puVar36 = (ulong *)((long)puVar36 + 4);
              puVar16 = (ulong *)((long)puVar16 + 4);
            }
            if ((puVar36 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar16 == (short)*puVar36)) {
              puVar36 = (ulong *)((long)puVar36 + 2);
              puVar16 = (ulong *)((long)puVar16 + 2);
            }
            if (puVar36 < source + ((ulong)(uint)inputSize - 5)) {
              puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar16 == (char)*puVar36));
            }
            uVar19 = (int)puVar36 - (int)puVar17;
          }
LAB_00114727:
          if (pcVar28 < (char *)((long)psVar33 + (ulong)(uVar19 + 0xf0) / 0xff + 8)) {
            return 0;
          }
          dest = (char *)(psVar33 + 1);
          if (uVar19 < 0xf) {
            *(char *)local_90 = (char)*local_90 + (char)uVar19;
          }
          else {
            *(char *)local_90 = (char)*local_90 + '\x0f';
            uVar14 = (ushort)(uVar19 - 0xf);
            *(short *)((long)dest + 0) = -1;
            *(short *)((long)dest + 2) = -1;
            if (0x3fb < uVar19 - 0xf) {
              uVar14 = (ushort)((ulong)(uVar19 - 0x40b) % 0x3fc);
              uVar5 = (ulong)((uVar19 - 0x40b) / 0x3fc << 2);
              memset(psVar33 + 3,0xff,uVar5 + 4);
              dest = (char *)((long)psVar33 + uVar5 + 6);
            }
            pcVar25 = (char *)((long)dest + (ulong)(uVar14 / 0xff));
            dest = pcVar25 + 1;
            *pcVar25 = (char)((uint)uVar14 % 0xff);
          }
          lVar13 = (long)local_b0 + (ulong)uVar19;
          local_b0 = (int *)(lVar13 + 4);
          if (source + ((ulong)(uint)inputSize - 0xb) <= local_b0) goto LAB_00114ca4;
          hashTable[(uint)(*(int *)(lVar13 + 2) * -0x61c8864f) >> 0x13] =
               ((short)lVar13 + 2) - sVar2;
          uVar19 = (uint)(*local_b0 * -0x61c8864f) >> 0x13;
          uVar14 = hashTable[uVar19];
          pcVar25 = (char *)(lVar32 + (ulong)uVar14);
          hashTable[uVar19] = (short)local_b0 - sVar2;
          piVar15 = local_b0;
          local_90 = (short *)dest;
          if (*(int *)(lVar32 + (ulong)uVar14) != *local_b0) goto LAB_0011449c;
          psVar33 = (short *)((long)dest + 1);
          *dest = '\0';
        } while( true );
      }
      if (maxOutputSize < 1) {
        return 0;
      }
LAB_00114429:
      *dest = '\0';
      return 1;
    }
    if ((uint)inputSize < 0x7e000001) {
      uVar19 = *(uint *)(hashTable + 0x2008);
      lVar32 = (long)source - (ulong)uVar19;
      plVar20 = (long *)(source + ((ulong)(uint)inputSize - 0xb));
      pcVar28 = dest + maxOutputSize;
      *(int *)(hashTable + 0x200c) = *(int *)(hashTable + 0x200c) + inputSize;
      *(uint *)(hashTable + 0x2008) = inputSize + uVar19;
      hashTable[0x200a] = 2;
      hashTable[0x200b] = 0;
      *(uint *)(hashTable + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 2) = uVar19;
      plVar6 = (long *)(source + 2);
      puVar12 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
      plVar31 = (long *)source;
LAB_00113afc:
      lVar13 = *(long *)((long)plVar31 + 1);
      plVar22 = (long *)((long)plVar31 + 1);
      uVar27 = acceleration;
      uVar19 = acceleration * 0x40;
      while( true ) {
        uVar19 = uVar19 + 1;
        uVar5 = (ulong)(lVar13 * -0x30e4432345000000) >> 0x34;
        uVar35 = *(uint *)(hashTable + uVar5 * 2);
        iVar11 = (int)plVar22;
        iVar18 = (int)lVar32;
        lVar13 = *plVar6;
        *(int *)(hashTable + uVar5 * 2) = iVar11 - iVar18;
        if (((uint)(iVar11 - iVar18) <= uVar35 + 0xffff) &&
           (*(int *)(lVar32 + (ulong)uVar35) == (int)*plVar22)) break;
        plVar7 = (long *)((ulong)uVar27 + (long)plVar6);
        uVar27 = uVar19 >> 6;
        plVar22 = plVar6;
        plVar6 = plVar7;
        if (plVar20 < plVar7) goto LAB_0011435f;
      }
      lVar8 = (ulong)uVar35 + lVar32;
      uVar27 = iVar11 - (int)plVar31;
      lVar13 = 0;
      uVar19 = uVar27 - 0xf;
      cVar3 = (char)plVar22 * '\x10' + (char)plVar31 * -0x10;
      do {
        cVar21 = cVar3;
        uVar35 = uVar19;
        lVar24 = lVar13;
        piVar15 = (int *)(lVar8 + lVar24);
        plVar6 = (long *)((long)plVar22 + lVar24);
        if ((piVar15 <= source) || (plVar6 <= plVar31)) break;
        lVar13 = lVar24 + -1;
        uVar19 = uVar35 - 1;
        cVar3 = cVar21 + -0x10;
      } while (*(char *)((long)plVar22 + lVar24 + -1) == *(char *)(lVar8 + -1 + lVar24));
      iVar1 = (int)lVar24;
      uVar5 = (ulong)(uint)(iVar1 + (iVar11 - (int)plVar31));
      if (pcVar28 < dest + ((ulong)uVar27 + lVar24 & 0xffffffff) / 0xff + uVar5 + 9) {
        return 0;
      }
      plVar22 = (long *)(dest + 1);
      if ((uint)((ulong)uVar27 + lVar24) < 0xf) {
        *dest = cVar21;
      }
      else {
        uVar4 = (ulong)(uVar27 - 0xf) + lVar24;
        *dest = -0x10;
        if (0xfe < (int)uVar4) {
          uVar19 = 0x1fd;
          if (uVar35 < 0x1fd) {
            uVar19 = uVar35;
          }
          if (0x1fc < (int)uVar35) {
            uVar35 = 0x1fd;
          }
          memset(plVar22,0xff,(ulong)((((uVar27 + 0xef) - uVar19) + iVar1) / 0xff + 1));
          uVar19 = ((uVar27 + 0xef) - uVar35) + iVar1;
          plVar22 = (long *)(dest + (ulong)uVar19 / 0xff + 2);
          uVar4 = (ulong)((uVar27 - 0x10e) + iVar1 + (uVar19 % 0xff - uVar19));
        }
        *(char *)plVar22 = (char)uVar4;
        plVar22 = (long *)((long)plVar22 + 1);
      }
      plVar7 = (long *)(uVar5 + (long)plVar22);
      do {
        *plVar22 = *plVar31;
        plVar22 = plVar22 + 1;
        plVar31 = plVar31 + 1;
      } while (plVar22 < plVar7);
      do {
        *(short *)plVar7 = (short)plVar6 - (short)piVar15;
        puVar17 = (ulong *)((long)plVar6 + 4);
        puVar16 = (ulong *)(piVar15 + 1);
        puVar36 = puVar17;
        if (puVar17 < puVar12) {
          if (*puVar16 == *puVar17) {
            puVar16 = (ulong *)(piVar15 + 3);
            puVar36 = (ulong *)((long)plVar6 + 0xc);
            goto LAB_00113d02;
          }
          uVar5 = *puVar17 ^ *puVar16;
          lVar13 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
            }
          }
          uVar19 = (uint)lVar13 >> 3;
        }
        else {
LAB_00113d02:
          if (puVar36 < puVar12) {
            iVar11 = ((int)puVar36 - (int)plVar6) + -4;
LAB_00113d10:
            if (*puVar16 == *puVar36) goto code_r0x00113d1c;
            uVar4 = *puVar36 ^ *puVar16;
            uVar5 = 0;
            if (uVar4 != 0) {
              for (; (uVar4 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            uVar19 = ((uint)(uVar5 >> 3) & 0x1fffffff) + iVar11;
            goto LAB_00113d95;
          }
LAB_00113d2c:
          if ((puVar36 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar16 == (int)*puVar36))
          {
            puVar36 = (ulong *)((long)puVar36 + 4);
            puVar16 = (ulong *)((long)puVar16 + 4);
          }
          if ((puVar36 < source + ((ulong)(uint)inputSize - 6)) &&
             ((short)*puVar16 == (short)*puVar36)) {
            puVar36 = (ulong *)((long)puVar36 + 2);
            puVar16 = (ulong *)((long)puVar16 + 2);
          }
          if (puVar36 < source + ((ulong)(uint)inputSize - 5)) {
            puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar16 == (char)*puVar36));
          }
          uVar19 = (int)puVar36 - (int)puVar17;
        }
LAB_00113d95:
        if (pcVar28 < (char *)((long)plVar7 + (ulong)(uVar19 + 0xf0) / 0xff + 8)) {
          return 0;
        }
        pcVar25 = (char *)((long)plVar7 + 2);
        if (uVar19 < 0xf) {
          *dest = *dest + (char)uVar19;
          dest = pcVar25;
        }
        else {
          *dest = *dest + '\x0f';
          uVar14 = (ushort)(uVar19 - 0xf);
          pcVar25[0] = -1;
          pcVar25[1] = -1;
          pcVar25[2] = -1;
          pcVar25[3] = -1;
          if (0x3fb < uVar19 - 0xf) {
            uVar14 = (ushort)((ulong)(uVar19 - 0x40b) % 0x3fc);
            uVar5 = (ulong)((uVar19 - 0x40b) / 0x3fc << 2);
            memset((char *)((long)plVar7 + 6),0xff,uVar5 + 4);
            pcVar25 = (char *)((long)plVar7 + uVar5 + 6);
          }
          pcVar25[uVar14 / 0xff] = (char)((uint)uVar14 % 0xff);
          dest = pcVar25 + uVar14 / 0xff + 1;
        }
        lVar13 = (long)plVar6 + (ulong)uVar19;
        plVar31 = (long *)(lVar13 + 4);
        if (plVar20 <= plVar31) goto LAB_0011435f;
        *(int *)(hashTable + ((ulong)(*(long *)(lVar13 + 2) * -0x30e4432345000000) >> 0x34) * 2) =
             ((int)lVar13 + 2) - iVar18;
        uVar5 = (ulong)(*plVar31 * -0x30e4432345000000) >> 0x34;
        uVar27 = (int)plVar31 - iVar18;
        uVar19 = *(uint *)(hashTable + uVar5 * 2);
        *(uint *)(hashTable + uVar5 * 2) = uVar27;
        if ((uVar19 + 0xffff < uVar27) ||
           (piVar15 = (int *)((ulong)uVar19 + lVar32), *piVar15 != *(int *)plVar31))
        goto LAB_00113eb2;
        plVar7 = (long *)(dest + 1);
        *dest = '\0';
        plVar6 = plVar31;
      } while( true );
    }
  }
  else if (inputSize < 0x1000b) {
    if ((uint)inputSize < 0x7e000001) {
      if (inputSize != 0) {
        uVar19 = *(uint *)(hashTable + 0x2008);
        *(int *)(hashTable + 0x200c) = *(int *)(hashTable + 0x200c) + inputSize;
        *(uint *)(hashTable + 0x2008) = uVar19 + inputSize;
        hashTable[0x200a] = 3;
        hashTable[0x200b] = 0;
        if (0xc < (uint)inputSize) {
          lVar32 = (long)source - (ulong)uVar19;
          hashTable[(uint)(*(int *)source * -0x61c8864f) >> 0x13] = (U16)uVar19;
          piVar15 = (int *)source;
LAB_001148ba:
          iVar11 = *(int *)((long)piVar15 + 1);
          uVar5 = 1;
          piVar9 = (int *)((long)piVar15 + 1);
          uVar19 = acceleration << 6;
          do {
            piVar10 = piVar9;
            piVar9 = (int *)(uVar5 + (long)piVar10);
            local_b0 = piVar15;
            if (source + ((ulong)(uint)inputSize - 0xb) < piVar9) goto LAB_00114c06;
            uVar5 = (ulong)(uVar19 >> 6);
            uVar19 = uVar19 + 1;
            uVar27 = (uint)(iVar11 * -0x61c8864f) >> 0x13;
            uVar14 = hashTable[uVar27];
            sVar2 = (short)lVar32;
            iVar11 = *piVar9;
            hashTable[uVar27] = (short)piVar10 - sVar2;
          } while (*(int *)(lVar32 + (ulong)uVar14) != *piVar10);
          lVar8 = (ulong)uVar14 + lVar32;
          iVar11 = (int)piVar10 - (int)piVar15;
          lVar13 = 0;
          cVar3 = (char)piVar10 * '\x10' + (char)piVar15 * -0x10;
          uVar19 = iVar11 - 0xfU;
          do {
            uVar27 = uVar19;
            cVar21 = cVar3;
            lVar24 = lVar13;
            pcVar28 = (char *)(lVar8 + lVar24);
            local_b0 = (int *)((long)piVar10 + lVar24);
            if ((pcVar28 <= source) || (local_b0 <= piVar15)) break;
            lVar13 = lVar24 + -1;
            cVar3 = cVar21 + -0x10;
            uVar19 = uVar27 - 1;
          } while (*(char *)((long)piVar10 + lVar24 + -1) == *(char *)(lVar8 + -1 + lVar24));
          iVar18 = (int)lVar24;
          psVar26 = (short *)((long)dest + 1);
          if ((uint)(iVar11 + iVar18) < 0xf) {
            *dest = cVar21;
          }
          else {
            uVar5 = (ulong)(iVar11 - 0xfU) + lVar24;
            *dest = -0x10;
            if (0xfe < (int)uVar5) {
              uVar19 = 0x1fd;
              if (uVar27 < 0x1fd) {
                uVar19 = uVar27;
              }
              if (0x1fc < (int)uVar27) {
                uVar27 = 0x1fd;
              }
              memset(psVar26,0xff,(ulong)((((iVar11 + 0xef) - uVar19) + iVar18) / 0xff + 1));
              uVar19 = ((iVar11 + 0xef) - uVar27) + iVar18;
              psVar26 = (short *)((long)dest + (ulong)uVar19 / 0xff + 2);
              uVar5 = (ulong)(iVar11 + -0x10e + iVar18 + (uVar19 % 0xff - uVar19));
            }
            *(char *)psVar26 = (char)uVar5;
            psVar26 = (short *)((long)psVar26 + 1);
          }
          psVar33 = (short *)((ulong)(uint)((int)local_b0 - (int)piVar15) + (long)psVar26);
          do {
            *(undefined8 *)psVar26 = *(undefined8 *)piVar15;
            psVar26 = psVar26 + 4;
            piVar15 = piVar15 + 2;
            psVar30 = (short *)dest;
          } while (psVar26 < psVar33);
          do {
            *psVar33 = (short)local_b0 - (short)pcVar28;
            dest = (char *)(psVar33 + 1);
            puVar12 = (ulong *)(local_b0 + 1);
            puVar17 = (ulong *)(pcVar28 + 4);
            puVar16 = puVar12;
            if (puVar12 < source + ((ulong)(uint)inputSize - 0xc)) {
              if (*puVar17 == *puVar12) {
                puVar17 = (ulong *)(pcVar28 + 0xc);
                puVar16 = (ulong *)(local_b0 + 3);
                goto LAB_00114a7f;
              }
              uVar4 = *puVar12 ^ *puVar17;
              uVar5 = 0;
              if (uVar4 != 0) {
                for (; (uVar4 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                }
              }
              uVar5 = uVar5 >> 3 & 0x1fffffff;
              local_b0 = (int *)((long)local_b0 + uVar5 + 4);
LAB_00114b38:
              *(char *)psVar30 = (char)*psVar30 + (char)uVar5;
            }
            else {
LAB_00114a7f:
              if (puVar16 < source + ((ulong)(uint)inputSize - 0xc)) {
                if (*puVar17 == *puVar16) goto code_r0x00114a93;
                uVar4 = *puVar16 ^ *puVar17;
                uVar5 = 0;
                if (uVar4 != 0) {
                  for (; (uVar4 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                  }
                }
                puVar16 = (ulong *)((long)puVar16 + (uVar5 >> 3 & 0x1fffffff));
              }
              else {
                if ((puVar16 < source + ((ulong)(uint)inputSize - 8)) &&
                   ((int)*puVar17 == (int)*puVar16)) {
                  puVar16 = (ulong *)((long)puVar16 + 4);
                  puVar17 = (ulong *)((long)puVar17 + 4);
                }
                if ((puVar16 < source + ((ulong)(uint)inputSize - 6)) &&
                   ((short)*puVar17 == (short)*puVar16)) {
                  puVar16 = (ulong *)((long)puVar16 + 2);
                  puVar17 = (ulong *)((long)puVar17 + 2);
                }
                if (puVar16 < source + ((ulong)(uint)inputSize - 5)) {
                  puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar17 == (char)*puVar16));
                }
              }
              uVar5 = (long)puVar16 - (long)puVar12;
              uVar19 = (uint)uVar5;
              local_b0 = (int *)((long)local_b0 + (uVar5 & 0xffffffff) + 4);
              if (uVar19 < 0xf) goto LAB_00114b38;
              *(char *)psVar30 = (char)*psVar30 + '\x0f';
              uVar27 = uVar19 - 0xf;
              *(short *)((long)dest + 0) = -1;
              *(short *)((long)dest + 2) = -1;
              if (0x3fb < uVar27) {
                uVar27 = (uVar19 - 0x40b) % 0x3fc;
                uVar5 = (ulong)((uVar19 - 0x40b) / 0x3fc << 2);
                memset(psVar33 + 3,0xff,uVar5 + 4);
                dest = (char *)((long)psVar33 + uVar5 + 6);
              }
              pcVar28 = (char *)((long)dest + (ulong)(ushort)((uVar27 & 0xffff) / 0xff));
              dest = pcVar28 + 1;
              *pcVar28 = (char)((uVar27 & 0xffff) % 0xff);
            }
            if (source + ((ulong)(uint)inputSize - 0xb) <= local_b0) break;
            hashTable[(uint)(*(int *)((long)local_b0 + -2) * -0x61c8864f) >> 0x13] =
                 ((short)local_b0 + -2) - sVar2;
            uVar19 = (uint)(*local_b0 * -0x61c8864f) >> 0x13;
            uVar14 = hashTable[uVar19];
            pcVar28 = (char *)(lVar32 + (ulong)uVar14);
            hashTable[uVar19] = (short)local_b0 - sVar2;
            piVar15 = local_b0;
            if (*(int *)(lVar32 + (ulong)uVar14) != *local_b0) goto LAB_001148ba;
            psVar33 = (short *)((long)dest + 1);
            *dest = '\0';
            psVar30 = (short *)dest;
          } while( true );
        }
LAB_00114c06:
        pcVar28 = source + ((ulong)(uint)inputSize - (long)local_b0);
        if (pcVar28 < (char *)0xf) {
          *dest = (char)pcVar28 << 4;
        }
        else {
          pcVar25 = pcVar28 + -0xf;
          *dest = -0x10;
          psVar26 = (short *)((long)dest + 1);
          if ((char *)0xfe < pcVar25) {
            uVar5 = (ulong)(pcVar28 + -0x10e) / 0xff;
            memset(psVar26,0xff,uVar5 + 1);
            pcVar25 = pcVar28 + uVar5 * -0xff + -0x10e;
            psVar26 = (short *)((long)dest + uVar5 + 2);
          }
          *(char *)psVar26 = (char)pcVar25;
          dest = (char *)psVar26;
        }
        memcpy((char *)((long)dest + 1),local_b0,(size_t)pcVar28);
        iVar11 = (int)(char *)((long)dest + 1) + (int)pcVar28;
        goto LAB_00114c8c;
      }
      goto LAB_00114429;
    }
  }
  else if ((uint)inputSize < 0x7e000001) {
    uVar19 = *(uint *)(hashTable + 0x2008);
    lVar32 = (long)source - (ulong)uVar19;
    plVar20 = (long *)(source + ((ulong)(uint)inputSize - 0xb));
    *(int *)(hashTable + 0x200c) = *(int *)(hashTable + 0x200c) + inputSize;
    *(uint *)(hashTable + 0x2008) = inputSize + uVar19;
    hashTable[0x200a] = 2;
    hashTable[0x200b] = 0;
    *(uint *)(hashTable + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 2) = uVar19;
    plVar6 = (long *)(source + 2);
    plVar31 = (long *)source;
LAB_00113f90:
    lVar13 = *(long *)((long)plVar31 + 1);
    plVar22 = (long *)((long)plVar31 + 1);
    uVar27 = acceleration;
    uVar19 = acceleration * 0x40;
    while( true ) {
      uVar19 = uVar19 + 1;
      uVar5 = (ulong)(lVar13 * -0x30e4432345000000) >> 0x34;
      uVar35 = *(uint *)(hashTable + uVar5 * 2);
      iVar11 = (int)lVar32;
      uVar29 = (int)plVar22 - iVar11;
      lVar13 = *plVar6;
      *(uint *)(hashTable + uVar5 * 2) = uVar29;
      if ((uVar29 <= uVar35 + 0xffff) && (*(int *)(lVar32 + (ulong)uVar35) == (int)*plVar22)) break;
      plVar7 = (long *)((ulong)uVar27 + (long)plVar6);
      uVar27 = uVar19 >> 6;
      plVar22 = plVar6;
      plVar6 = plVar7;
      if (plVar20 < plVar7) goto LAB_001142eb;
    }
    lVar8 = (ulong)uVar35 + lVar32;
    iVar18 = (int)plVar22 - (int)plVar31;
    lVar13 = 0;
    cVar3 = (char)plVar22 * '\x10' + (char)plVar31 * -0x10;
    uVar19 = iVar18 - 0xfU;
    do {
      uVar27 = uVar19;
      cVar21 = cVar3;
      lVar24 = lVar13;
      piVar15 = (int *)(lVar8 + lVar24);
      plVar6 = (long *)((long)plVar22 + lVar24);
      if ((piVar15 <= source) || (plVar6 <= plVar31)) break;
      lVar13 = lVar24 + -1;
      cVar3 = cVar21 + -0x10;
      uVar19 = uVar27 - 1;
    } while (*(char *)((long)plVar22 + lVar24 + -1) == *(char *)(lVar8 + -1 + lVar24));
    iVar1 = (int)lVar24;
    plVar22 = (long *)(dest + 1);
    if ((uint)(iVar18 + iVar1) < 0xf) {
      *dest = cVar21;
    }
    else {
      uVar5 = (ulong)(iVar18 - 0xfU) + lVar24;
      *dest = -0x10;
      if (0xfe < (int)uVar5) {
        uVar19 = 0x1fd;
        if (uVar27 < 0x1fd) {
          uVar19 = uVar27;
        }
        if (0x1fc < (int)uVar27) {
          uVar27 = 0x1fd;
        }
        memset(plVar22,0xff,(ulong)((((iVar18 + 0xef) - uVar19) + iVar1) / 0xff + 1));
        uVar19 = ((iVar18 + 0xef) - uVar27) + iVar1;
        plVar22 = (long *)(dest + (ulong)uVar19 / 0xff + 2);
        uVar5 = (ulong)(iVar18 + -0x10e + iVar1 + (uVar19 % 0xff - uVar19));
      }
      *(char *)plVar22 = (char)uVar5;
      plVar22 = (long *)((long)plVar22 + 1);
    }
    plVar7 = (long *)((ulong)(uint)((int)plVar6 - (int)plVar31) + (long)plVar22);
    do {
      *plVar22 = *plVar31;
      plVar22 = plVar22 + 1;
      plVar31 = plVar31 + 1;
    } while (plVar22 < plVar7);
    do {
      *(short *)plVar7 = (short)plVar6 - (short)piVar15;
      pcVar28 = (char *)((long)plVar7 + 2);
      puVar12 = (ulong *)((long)plVar6 + 4);
      puVar17 = (ulong *)(piVar15 + 1);
      puVar16 = puVar12;
      if (puVar12 < source + ((ulong)(uint)inputSize - 0xc)) {
        if (*puVar17 == *puVar12) {
          puVar17 = (ulong *)(piVar15 + 3);
          puVar16 = (ulong *)((long)plVar6 + 0xc);
          goto LAB_0011414f;
        }
        uVar4 = *puVar12 ^ *puVar17;
        uVar5 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        uVar5 = uVar5 >> 3 & 0x1fffffff;
        plVar31 = (long *)((long)plVar6 + uVar5 + 4);
LAB_0011420a:
        *dest = *dest + (char)uVar5;
        dest = pcVar28;
      }
      else {
LAB_0011414f:
        if (puVar16 < source + ((ulong)(uint)inputSize - 0xc)) {
          if (*puVar17 == *puVar16) goto code_r0x00114163;
          uVar4 = *puVar16 ^ *puVar17;
          uVar5 = 0;
          if (uVar4 != 0) {
            for (; (uVar4 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
            }
          }
          puVar16 = (ulong *)((long)puVar16 + (uVar5 >> 3 & 0x1fffffff));
        }
        else {
          if ((puVar16 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar17 == (int)*puVar16))
          {
            puVar16 = (ulong *)((long)puVar16 + 4);
            puVar17 = (ulong *)((long)puVar17 + 4);
          }
          if ((puVar16 < source + ((ulong)(uint)inputSize - 6)) &&
             ((short)*puVar17 == (short)*puVar16)) {
            puVar16 = (ulong *)((long)puVar16 + 2);
            puVar17 = (ulong *)((long)puVar17 + 2);
          }
          if (puVar16 < source + ((ulong)(uint)inputSize - 5)) {
            puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar17 == (char)*puVar16));
          }
        }
        uVar5 = (long)puVar16 - (long)puVar12;
        uVar19 = (uint)uVar5;
        plVar31 = (long *)((long)plVar6 + (uVar5 & 0xffffffff) + 4);
        if (uVar19 < 0xf) goto LAB_0011420a;
        *dest = *dest + '\x0f';
        uVar27 = uVar19 - 0xf;
        pcVar28[0] = -1;
        pcVar28[1] = -1;
        pcVar28[2] = -1;
        pcVar28[3] = -1;
        if (0x3fb < uVar27) {
          uVar27 = (uVar19 - 0x40b) % 0x3fc;
          uVar5 = (ulong)((uVar19 - 0x40b) / 0x3fc << 2);
          memset((char *)((long)plVar7 + 6),0xff,uVar5 + 4);
          pcVar28 = (char *)((long)plVar7 + uVar5 + 6);
        }
        pcVar28[(ushort)((uVar27 & 0xffff) / 0xff)] = (char)((uVar27 & 0xffff) % 0xff);
        dest = pcVar28 + (ushort)((uVar27 & 0xffff) / 0xff) + 1;
      }
      if (plVar20 <= plVar31) goto LAB_001142eb;
      *(int *)(hashTable +
              ((ulong)(*(long *)((long)plVar31 + -2) * -0x30e4432345000000) >> 0x34) * 2) =
           ((int)plVar31 + -2) - iVar11;
      uVar5 = (ulong)(*plVar31 * -0x30e4432345000000) >> 0x34;
      uVar27 = (int)plVar31 - iVar11;
      uVar19 = *(uint *)(hashTable + uVar5 * 2);
      *(uint *)(hashTable + uVar5 * 2) = uVar27;
      if ((uVar19 + 0xffff < uVar27) ||
         (piVar15 = (int *)((ulong)uVar19 + lVar32), *piVar15 != (int)*plVar31)) goto LAB_001142c8;
      plVar7 = (long *)(dest + 1);
      *dest = '\0';
      plVar6 = plVar31;
    } while( true );
  }
  return 0;
code_r0x00114163:
  puVar17 = puVar17 + 1;
  puVar16 = puVar16 + 1;
  goto LAB_0011414f;
LAB_001142c8:
  plVar6 = (long *)((long)plVar31 + 2);
  if (plVar20 < plVar6) goto LAB_001142eb;
  goto LAB_00113f90;
code_r0x00114a93:
  puVar17 = puVar17 + 1;
  puVar16 = puVar16 + 1;
  goto LAB_00114a7f;
code_r0x001146af:
  puVar36 = puVar36 + 1;
  puVar16 = puVar16 + 1;
  iVar11 = iVar11 + 8;
  if (puVar12 <= puVar36) goto LAB_001146bf;
  goto LAB_001146a4;
code_r0x00113d1c:
  puVar36 = puVar36 + 1;
  puVar16 = puVar16 + 1;
  iVar11 = iVar11 + 8;
  if (puVar12 <= puVar36) goto LAB_00113d2c;
  goto LAB_00113d10;
LAB_00113eb2:
  plVar6 = (long *)(lVar13 + 6);
  if (plVar20 < plVar6) {
LAB_0011435f:
    pcVar25 = source + ((ulong)(uint)inputSize - (long)plVar31);
    if (pcVar28 < dest + (long)(pcVar25 + (ulong)(pcVar25 + 0xf0) / 0xff + 1)) {
      return 0;
    }
    if (pcVar25 < (char *)0xf) {
      *dest = (char)pcVar25 << 4;
    }
    else {
      pcVar28 = pcVar25 + -0xf;
      *dest = -0x10;
      pcVar23 = dest + 1;
      if ((char *)0xfe < pcVar28) {
        uVar5 = (ulong)(pcVar25 + -0x10e) / 0xff;
        memset(pcVar23,0xff,uVar5 + 1);
        pcVar28 = pcVar25 + uVar5 * -0xff + -0x10e;
        pcVar23 = dest + uVar5 + 2;
      }
      *pcVar23 = (char)pcVar28;
      dest = pcVar23;
    }
    memcpy(dest + 1,plVar31,(size_t)pcVar25);
    return ((int)(dest + 1) + (int)pcVar25) - iVar34;
  }
  goto LAB_00113afc;
LAB_001142eb:
  pcVar28 = source + ((ulong)(uint)inputSize - (long)plVar31);
  if (pcVar28 < (char *)0xf) {
    *dest = (char)pcVar28 << 4;
  }
  else {
    pcVar23 = pcVar28 + -0xf;
    *dest = -0x10;
    pcVar25 = dest + 1;
    if ((char *)0xfe < pcVar23) {
      uVar5 = (ulong)(pcVar28 + -0x10e) / 0xff;
      memset(pcVar25,0xff,uVar5 + 1);
      pcVar23 = pcVar28 + uVar5 * -0xff + -0x10e;
      pcVar25 = dest + uVar5 + 2;
    }
    *pcVar25 = (char)pcVar23;
    dest = pcVar25;
  }
  memcpy(dest + 1,plVar31,(size_t)pcVar28);
  iVar11 = (int)(dest + 1) + (int)pcVar28;
LAB_00114c8c:
  return iVar11 - iVar34;
}

Assistant:

int LZ4_compress_fast_extState(void* state, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* const ctx = & LZ4_initStream(state, sizeof(LZ4_stream_t)) -> internal_donotuse;
    assert(ctx != NULL);
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;
    if (maxOutputSize >= LZ4_compressBound(inputSize)) {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}